

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_color_quantity.cpp
# Opt level: O1

void __thiscall polyscope::PointCloudColorQuantity::draw(PointCloudColorQuantity *this)

{
  if ((this->super_PointCloudQuantity).super_Quantity<polyscope::PointCloud>.enabled.value == true)
  {
    if ((this->pointProgram).
        super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      createPointProgram(this);
    }
    Structure::setTransformUniforms
              ((Structure *)
               (this->super_PointCloudQuantity).super_Quantity<polyscope::PointCloud>.parent,
               (this->pointProgram).
               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    PointCloud::setPointCloudUniforms
              ((this->super_PointCloudQuantity).super_Quantity<polyscope::PointCloud>.parent,
               (this->pointProgram).
               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    (*((this->pointProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x1e])();
    return;
  }
  return;
}

Assistant:

void PointCloudColorQuantity::draw() {
  if (!isEnabled()) return;

  // Make the program if we don't have one already
  if (pointProgram == nullptr) {
    createPointProgram();
  }

  parent.setTransformUniforms(*pointProgram);
  parent.setPointCloudUniforms(*pointProgram);

  pointProgram->draw();
}